

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O1

OptionStatus
passLocalOptions(HighsLogOptions *report_log_options,HighsOptions *from_options,
                HighsOptions *to_options)

{
  HighsOptionType HVar1;
  HighsInt value_00;
  OptionRecordDouble *pOVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  OptionRecordString *pOVar5;
  OptionStatus OVar6;
  OptionStatus OVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  string value;
  OptionStatus local_b4;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  _func_int *local_78;
  string local_70;
  string local_50;
  
  local_78 = (_func_int *)
             ((ulong)((long)(to_options->records).
                            super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(to_options->records).
                           super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar8 = (uint)local_78;
  bVar10 = 0 < (int)uVar8;
  if (0 < (int)uVar8) {
    uVar9 = 1;
    do {
      pOVar2 = (OptionRecordDouble *)
               (to_options->records).
               super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9 - 1];
      HVar1 = (pOVar2->super_OptionRecord).type;
      if (HVar1 == kString) {
        pp_Var3 = (from_options->records).
                  super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9 - 1][1]._vptr_OptionRecord;
        local_98 = local_88;
        p_Var4 = *pp_Var3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,p_Var4,pp_Var3[1] + (long)p_Var4);
        pOVar5 = (OptionRecordString *)
                 (to_options->records).
                 super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9 - 1];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_98,local_98 + local_90);
        OVar7 = checkOptionValue(report_log_options,pOVar5,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (OVar7 != kOk) {
          local_b4 = OVar7;
        }
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
        OVar6 = local_b4;
        if (OVar7 == kOk) goto LAB_002538ca;
LAB_002538b9:
        local_b4 = OVar6;
        bVar11 = false;
      }
      else {
        if (HVar1 == kDouble) {
          OVar6 = checkOptionValue(report_log_options,pOVar2,
                                   (double)*(from_options->records).
                                            super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar9 - 1][1].
                                            _vptr_OptionRecord);
        }
        else {
          if (HVar1 != kInt) goto LAB_002538ca;
          OVar6 = checkOptionValue(report_log_options,(OptionRecordInt *)pOVar2,
                                   *(HighsInt *)
                                    (from_options->records).
                                    super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar9 - 1][1].
                                    _vptr_OptionRecord);
        }
        if (OVar6 != kOk) goto LAB_002538b9;
LAB_002538ca:
        bVar11 = true;
      }
      if (!bVar11) break;
      bVar10 = uVar9 < (uVar8 & 0x7fffffff);
      bVar11 = uVar9 != (uVar8 & 0x7fffffff);
      uVar9 = uVar9 + 1;
    } while (bVar11);
  }
  if (!bVar10) {
    uVar8 = (uint)local_78;
    if (0 < (int)uVar8) {
      uVar9 = 0;
      do {
        pOVar2 = (OptionRecordDouble *)
                 (to_options->records).
                 super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
        HVar1 = (pOVar2->super_OptionRecord).type;
        if (HVar1 == kDouble) {
          local_78 = *(from_options->records).
                      super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9][1]._vptr_OptionRecord;
          OVar7 = checkOptionValue(report_log_options,pOVar2,(double)local_78);
          if (OVar7 == kOk) {
            *pOVar2->value = (double)local_78;
            OVar7 = kOk;
          }
          if (OVar7 == kOk) goto LAB_00253afe;
          bVar10 = false;
          local_b4 = OVar7;
        }
        else {
          if (HVar1 == kInt) {
            value_00 = *(HighsInt *)
                        (from_options->records).
                        super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar9][1]._vptr_OptionRecord;
            OVar7 = checkOptionValue(report_log_options,(OptionRecordInt *)pOVar2,value_00);
            if (OVar7 == kOk) {
              *(HighsInt *)pOVar2->value = value_00;
              OVar7 = kOk;
            }
            if (OVar7 != kOk) {
              bVar10 = false;
              local_b4 = OVar7;
              goto LAB_00253b00;
            }
          }
          else if (HVar1 == kBool) {
            *(undefined1 *)pOVar2->value =
                 *(undefined1 *)
                  (from_options->records).
                  super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9][1]._vptr_OptionRecord;
          }
          else {
            pp_Var3 = (from_options->records).
                      super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9][1]._vptr_OptionRecord;
            p_Var4 = *pp_Var3;
            local_98 = local_88;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,p_Var4,pp_Var3[1] + (long)p_Var4);
            pOVar5 = (OptionRecordString *)
                     (to_options->records).
                     super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9];
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,local_98,local_98 + local_90);
            OVar7 = setLocalOptionValue(report_log_options,pOVar5,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if (OVar7 != kOk) {
              local_b4 = OVar7;
            }
            if (local_98 != local_88) {
              operator_delete(local_98);
            }
            if (OVar7 != kOk) {
              bVar10 = false;
              goto LAB_00253b00;
            }
          }
LAB_00253afe:
          bVar10 = true;
        }
LAB_00253b00:
        if (!bVar10) {
          return local_b4;
        }
        uVar9 = uVar9 + 1;
      } while ((uVar8 & 0x7fffffff) != uVar9);
    }
    local_b4 = kOk;
  }
  return local_b4;
}

Assistant:

OptionStatus passLocalOptions(const HighsLogOptions& report_log_options,
                              const HighsOptions& from_options,
                              HighsOptions& to_options) {
  // (Attempt to) set option value from the HighsOptions passed in
  OptionStatus return_status;
  //  std::string empty_file = "";
  //  std::string from_log_file = from_options.log_file;
  //  std::string original_to_log_file = to_options.log_file;
  //  FILE* original_to_log_stream =
  //  to_options.log_options.log_stream;
  HighsInt num_options = to_options.records.size();
  // Check all the option values before setting any of them - in case
  // to_options are the main Highs options. Checks are only needed for
  // HighsInt, double and string since bool values can't be illegal
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = to_options.records[index]->type;
    if (type == HighsOptionType::kInt) {
      HighsInt value =
          *(((OptionRecordInt*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options, ((OptionRecordInt*)to_options.records[index])[0],
          value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kDouble) {
      double value =
          *(((OptionRecordDouble*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options,
          ((OptionRecordDouble*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kString) {
      std::string value =
          *(((OptionRecordString*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options,
          ((OptionRecordString*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    }
  }
  // Checked from_options and found it to be OK, so set all the values
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = to_options.records[index]->type;
    if (type == HighsOptionType::kBool) {
      bool value = *(((OptionRecordBool*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          ((OptionRecordBool*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kInt) {
      HighsInt value =
          *(((OptionRecordInt*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options, ((OptionRecordInt*)to_options.records[index])[0],
          value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kDouble) {
      double value =
          *(((OptionRecordDouble*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options,
          ((OptionRecordDouble*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else {
      std::string value =
          *(((OptionRecordString*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options,
          ((OptionRecordString*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    }
  }
  /*
  if (from_log_file.compare(original_to_log_file)) {
    // The log file name has changed
    if (from_options.log_options.log_stream &&
        !original_to_log_file.compare(empty_file)) {
      // The stream corresponding to from_log_file is non-null and the
      // original log file name was empty, so to_options inherits the
      // stream, but associated with the (necessarily) non-empty name
      // from_log_file
      //
      // This ensures that the stream to Highs.log opened in
      // RunHighs.cpp is retained unless the log file name is changed.
      assert(from_log_file.compare(empty_file));
      assert(!original_to_log_stream);
      to_options.log_options.log_stream =
          from_options.log_options.log_stream;
    } else {
      highsOpenLogFile(to_options, to_options.log_file);
    }
  }
  */
  return OptionStatus::kOk;
}